

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dht(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  JOCTET *pJVar4;
  boolean bVar5;
  JHUFF_TBL *pJVar6;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  JHUFF_TBL **htblptr;
  uint local_140;
  int count;
  int index;
  int i;
  UINT8 huffval [256];
  UINT8 bits [17];
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  _mp = (int *)pjVar2->bytes_in_buffer;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    _mp = (int *)pjVar2->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    _mp = (int *)pjVar2->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  register0x00000000 = (ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100 + -2;
  bytes_in_buffer = bytes_in_buffer + 1;
  do {
    if (stack0xffffffffffffffe0 < 0x11) {
      if (stack0xffffffffffffffe0 != 0) {
        cinfo->err->msg_code = 0xc;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pjVar2->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar2->bytes_in_buffer = (size_t)_mp;
      return 1;
    }
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar2->next_input_byte;
      _mp = (int *)pjVar2->bytes_in_buffer;
    }
    bVar1 = *(byte *)bytes_in_buffer;
    local_140 = (uint)bVar1;
    cinfo->err->msg_code = 0x52;
    (cinfo->err->msg_parm).i[0] = local_140;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    huffval[0xf8] = '\0';
    htblptr._4_4_ = 0;
    count = 1;
    while( true ) {
      bytes_in_buffer = bytes_in_buffer + 1;
      _mp = (int *)((long)_mp + -1);
      if (0x10 < count) break;
      if (_mp == (int *)0x0) {
        bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
        if (bVar5 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar2->next_input_byte;
        _mp = (int *)pjVar2->bytes_in_buffer;
      }
      huffval[(long)count + 0xf8] = *(UINT8 *)bytes_in_buffer;
      htblptr._4_4_ = (uint)huffval[(long)count + 0xf8] + htblptr._4_4_;
      count = count + 1;
    }
    pjVar3 = cinfo->err;
    *(uint *)&pjVar3->msg_parm = (uint)huffval[0xf9];
    *(uint *)((long)&pjVar3->msg_parm + 4) = (uint)huffval[0xfa];
    *(uint *)((long)&pjVar3->msg_parm + 8) = (uint)huffval[0xfb];
    *(uint *)((long)&pjVar3->msg_parm + 0xc) = (uint)huffval[0xfc];
    *(uint *)((long)&pjVar3->msg_parm + 0x10) = (uint)huffval[0xfd];
    *(uint *)((long)&pjVar3->msg_parm + 0x14) = (uint)huffval[0xfe];
    *(uint *)((long)&pjVar3->msg_parm + 0x18) = (uint)huffval[0xff];
    *(uint *)((long)&pjVar3->msg_parm + 0x1c) = (uint)bits[0];
    cinfo->err->msg_code = 0x58;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,2);
    pjVar3 = cinfo->err;
    *(uint *)&pjVar3->msg_parm = (uint)bits[1];
    *(uint *)((long)&pjVar3->msg_parm + 4) = (uint)bits[2];
    *(uint *)((long)&pjVar3->msg_parm + 8) = (uint)bits[3];
    *(uint *)((long)&pjVar3->msg_parm + 0xc) = (uint)bits[4];
    *(uint *)((long)&pjVar3->msg_parm + 0x10) = (uint)bits[5];
    *(uint *)((long)&pjVar3->msg_parm + 0x14) = (uint)bits[6];
    *(uint *)((long)&pjVar3->msg_parm + 0x18) = (uint)bits[7];
    *(uint *)((long)&pjVar3->msg_parm + 0x1c) = (uint)bits[8];
    cinfo->err->msg_code = 0x58;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,2);
    if ((0x100 < htblptr._4_4_) || (stack0xffffffffffffffe0 + -0x11 < (long)htblptr._4_4_)) {
      cinfo->err->msg_code = 9;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    for (count = 0; count < htblptr._4_4_; count = count + 1) {
      if (_mp == (int *)0x0) {
        bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
        if (bVar5 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar2->next_input_byte;
        _mp = (int *)pjVar2->bytes_in_buffer;
      }
      _mp = (int *)((long)_mp + -1);
      *(undefined1 *)((long)&index + (long)count) = *(undefined1 *)bytes_in_buffer;
      bytes_in_buffer = bytes_in_buffer + 1;
    }
    register0x00000000 = (stack0xffffffffffffffe0 + -0x11) - (long)htblptr._4_4_;
    if ((bVar1 & 0x10) == 0) {
      datasrc = (jpeg_source_mgr *)(cinfo->dc_huff_tbl_ptrs + (int)local_140);
    }
    else {
      local_140 = local_140 - 0x10;
      datasrc = (jpeg_source_mgr *)(cinfo->ac_huff_tbl_ptrs + (int)local_140);
    }
    if (((int)local_140 < 0) || (3 < (int)local_140)) {
      cinfo->err->msg_code = 0x1f;
      (cinfo->err->msg_parm).i[0] = local_140;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (datasrc->next_input_byte == (JOCTET *)0x0) {
      pJVar6 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      datasrc->next_input_byte = pJVar6->bits;
    }
    pJVar4 = datasrc->next_input_byte;
    *(ulong *)pJVar4 =
         CONCAT17(huffval[0xff],
                  CONCAT16(huffval[0xfe],
                           CONCAT15(huffval[0xfd],
                                    CONCAT14(huffval[0xfc],
                                             CONCAT13(huffval[0xfb],
                                                      CONCAT12(huffval[0xfa],
                                                               CONCAT11(huffval[0xf9],huffval[0xf8])
                                                              ))))));
    *(ulong *)(pJVar4 + 8) =
         CONCAT17(bits[7],CONCAT16(bits[6],CONCAT15(bits[5],CONCAT14(bits[4],CONCAT13(bits[3],
                                                  CONCAT12(bits[2],CONCAT11(bits[1],bits[0])))))));
    pJVar4[0x10] = bits[8];
    memcpy(datasrc->next_input_byte + 0x11,&index,0x100);
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dht (j_decompress_ptr cinfo)
/* Process a DHT marker */
{
  INT32 length;
  UINT8 bits[17];
  UINT8 huffval[256];
  int i, index, count;
  JHUFF_TBL **htblptr;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;
  
  while (length > 16) {
    INPUT_BYTE(cinfo, index, return FALSE);

    TRACEMS1(cinfo, 1, JTRC_DHT, index);
      
    bits[0] = 0;
    count = 0;
    for (i = 1; i <= 16; i++) {
      INPUT_BYTE(cinfo, bits[i], return FALSE);
      count += bits[i];
    }

    length -= 1 + 16;

    TRACEMS8(cinfo, 2, JTRC_HUFFBITS,
	     bits[1], bits[2], bits[3], bits[4],
	     bits[5], bits[6], bits[7], bits[8]);
    TRACEMS8(cinfo, 2, JTRC_HUFFBITS,
	     bits[9], bits[10], bits[11], bits[12],
	     bits[13], bits[14], bits[15], bits[16]);

    /* Here we just do minimal validation of the counts to avoid walking
     * off the end of our table space.  jdhuff.c will check more carefully.
     */
    if (count > 256 || ((INT32) count) > length)
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

    for (i = 0; i < count; i++)
      INPUT_BYTE(cinfo, huffval[i], return FALSE);

    length -= count;

    if (index & 0x10) {		/* AC table definition */
      index -= 0x10;
      htblptr = &cinfo->ac_huff_tbl_ptrs[index];
    } else {			/* DC table definition */
      htblptr = &cinfo->dc_huff_tbl_ptrs[index];
    }

    if (index < 0 || index >= NUM_HUFF_TBLS)
      ERREXIT1(cinfo, JERR_DHT_INDEX, index);

    if (*htblptr == NULL)
      *htblptr = jpeg_alloc_huff_table((j_common_ptr) cinfo);
  
    MEMCOPY((*htblptr)->bits, bits, SIZEOF((*htblptr)->bits));
    MEMCOPY((*htblptr)->huffval, huffval, SIZEOF((*htblptr)->huffval));
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}